

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timsort.h
# Opt level: O0

void libxml_domnode_tim_sort_resize(TEMP_STORAGE_T *store,size_t new_size)

{
  xmlNodePtr *ppxVar1;
  xmlNodePtr *tempstore;
  size_t new_size_local;
  TEMP_STORAGE_T *store_local;
  
  if (store->alloc < new_size) {
    ppxVar1 = (xmlNodePtr *)realloc(store->storage,new_size << 3);
    if (ppxVar1 == (xmlNodePtr *)0x0) {
      fprintf(_stderr,"Error allocating temporary storage for tim sort: need %lu bytes",
              new_size << 3);
      exit(1);
    }
    store->storage = ppxVar1;
    store->alloc = new_size;
  }
  return;
}

Assistant:

static void TIM_SORT_RESIZE(TEMP_STORAGE_T *store, const size_t new_size) {
  if (store->alloc < new_size) {
    SORT_TYPE *tempstore = (SORT_TYPE *)realloc(store->storage, new_size * sizeof(SORT_TYPE));

    if (tempstore == NULL) {
      fprintf(stderr, "Error allocating temporary storage for tim sort: need %lu bytes",
              (unsigned long)(sizeof(SORT_TYPE) * new_size));
      exit(1);
    }

    store->storage = tempstore;
    store->alloc = new_size;
  }
}